

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_windows.cpp
# Opt level: O2

void __thiscall Am_Drawonable_Impl::Set_Cut_Buffer(Am_Drawonable_Impl *this,char *s)

{
  Display *pDVar1;
  size_t sVar2;
  char *__dest;
  unsigned_long uVar3;
  Screen_Desc *pSVar4;
  
  if ((s != (char *)0x0) && (this->offscreen == false)) {
    XRotateBuffers(this->screen->display,1);
    pDVar1 = this->screen->display;
    sVar2 = strlen(s);
    XStoreBytes(pDVar1,s,(int)sVar2 + 1);
    pSVar4 = this->screen;
    if (pSVar4->cut_data != (char *)0x0) {
      operator_delete__(pSVar4->cut_data);
      pSVar4 = this->screen;
    }
    sVar2 = strlen(s);
    __dest = (char *)operator_new__(sVar2 + 1);
    pSVar4->cut_data = __dest;
    strcpy(__dest,s);
    if (Am_Current_Input_Event == (Am_Input_Event *)0x0) {
      uVar3 = 0xffffffffffffffff;
    }
    else {
      uVar3 = Am_Current_Input_Event->time_stamp;
    }
    XSetSelectionOwner(pSVar4->display,1,this->xlib_drawable,uVar3);
    return;
  }
  return;
}

Assistant:

void
Am_Drawonable_Impl::Set_Cut_Buffer(const char *s)
{
  // X says that if you have to use cut buffers (instead of selections,
  // which are complicated and annoying), then you should do this:
  // First, make sure all 8 buffers exist by concatting 0 length data
  // to them.  We do this in get_root_drawonable when we first make
  // the display.
  // Second, when setting the buffer, rotate the buffers by 1 first.
  if (!s || offscreen)
    return; // do nothing with a nullptr string for now.

  XRotateBuffers(screen->display, 1);
  // +1 byte for the /0.
  XStoreBytes(screen->display, s, (strlen(s) + 1) * sizeof(char));

  /////
  // We want to use selections as well, to be more ICCC compliant.
  // Set the string into our cut buffer property on this screen,
  // then grab the X selection.  The real work is done later when
  // we get selection request events.
  //  XChangeProperty(screen->display, screen->root->xlib_drawable,
  //		  screen->cut_buffer, XA_STRING, 8 /* data quantization */,
  //		  PropModeReplace, (const unsigned char*)s, strlen(s));

  if (screen->cut_data != nullptr)
    delete[] screen->cut_data;
  screen->cut_data = new char[(strlen(s) + 1) * sizeof(char)];
  strcpy(screen->cut_data, s);

  // Use the time of the most recent input event- assume that event
  // triggered this cut.
  Time time = Am_Current_Input_Event
                  ? Am_Current_Input_Event->time_stamp
                  : CurrentTime - 1; // they say, don't use current time.
  XSetSelectionOwner(screen->display, XA_PRIMARY, xlib_drawable, time);
}